

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O0

REF_STATUS ref_cavity_verify_seg_manifold(REF_CAVITY ref_cavity)

{
  int local_24;
  int local_20;
  REF_INT found_seg;
  REF_INT seg1;
  REF_INT seg0;
  REF_CAVITY ref_cavity_local;
  
  if (ref_cavity->state != REF_CAVITY_INCONSISTENT) {
    for (found_seg = 0; found_seg < ref_cavity->maxseg; found_seg = found_seg + 1) {
      if (((-1 < found_seg) && (found_seg < ref_cavity->maxseg)) &&
         (ref_cavity->s2n[found_seg * 3] != -1)) {
        local_24 = -1;
        for (local_20 = 0; local_20 < ref_cavity->maxseg; local_20 = local_20 + 1) {
          if (((-1 < local_20) && (local_20 < ref_cavity->maxseg)) &&
             ((ref_cavity->s2n[local_20 * 3] != -1 &&
              (ref_cavity->s2n[found_seg * 3 + 1] == ref_cavity->s2n[local_20 * 3])))) {
            if (local_24 != -1) {
              ref_cavity->state = REF_CAVITY_INCONSISTENT;
              return 0;
            }
            local_24 = local_20;
          }
        }
        if (local_24 == -1) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x203,"ref_cavity_verify_seg_manifold","seg missing");
          return 1;
        }
      }
    }
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_cavity_verify_seg_manifold(
    REF_CAVITY ref_cavity) {
  REF_INT seg0, seg1, found_seg;

  if (REF_CAVITY_INCONSISTENT == ref_cavity_state(ref_cavity))
    return REF_SUCCESS;

  each_ref_cavity_valid_seg(ref_cavity, seg0) {
    found_seg = REF_EMPTY;
    each_ref_cavity_valid_seg(ref_cavity, seg1) {
      if (ref_cavity_s2n(ref_cavity, 1, seg0) ==
          ref_cavity_s2n(ref_cavity, 0, seg1)) {
        if (REF_EMPTY != found_seg) { /* found seg twice */
          ref_cavity_state(ref_cavity) = REF_CAVITY_INCONSISTENT;
          return REF_SUCCESS;
        }
        found_seg = seg1;
      }
    }
    RUS(REF_EMPTY, found_seg, "seg missing");
  }

  return REF_SUCCESS;
}